

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_operators.hpp
# Opt level: O0

string * __thiscall
viennamath::op_binary<viennamath::op_minus<double>,viennamath::rt_expression_interface<double>>::
str_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  op_binary<viennamath::op_minus<double>,_viennamath::rt_expression_interface<double>_> *this_local;
  
  op_minus<double>::str_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

std::string str() const { return BinaryOperation::str(); }